

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fetch.hpp
# Opt level: O2

void __thiscall
TI::TMS::SpriteFetcher<(TI::TMS::Personality)1,_(TI::TMS::SpriteMode)1>::fetch_pattern
          (SpriteFetcher<(TI::TMS::Personality)1,_(TI::TMS::SpriteMode)1> *this,int slot)

{
  fetch_image(this,slot,this->base->name_[0]);
  fetch_image(this,slot + 1,this->base->name_[1]);
  return;
}

Assistant:

void fetch_pattern(int slot) {
			switch(mode) {
				case SpriteMode::Mode1:
					fetch_image(slot, name(slot));
				break;

				case SpriteMode::Mode2:
					fetch_image(slot, base->name_[0]);
					fetch_image(slot + 1, base->name_[1]);
				break;
			}
		}